

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void renameColumnElistNames(Parse *pParse,RenameCtx *pCtx,ExprList *pEList,char *zOld)

{
  int iVar1;
  char *zLeft;
  int iVar2;
  RenameToken *pToken;
  RenameToken *pRVar3;
  RenameToken *pRVar4;
  RenameToken **ppRVar5;
  long lVar6;
  
  if ((pEList != (ExprList *)0x0) && (iVar1 = pEList->nExpr, 0 < (long)iVar1)) {
    lVar6 = 0;
    do {
      zLeft = pEList->a[lVar6].zName;
      iVar2 = -(uint)(zOld != (char *)0x0);
      if (zLeft == (char *)0x0) {
LAB_0019c64f:
        if ((iVar2 == 0) && (pRVar4 = pParse->pRename, pRVar4 != (RenameToken *)0x0)) {
          ppRVar5 = &pParse->pRename;
          if ((char *)pRVar4->p != zLeft) {
            do {
              pRVar3 = pRVar4;
              pRVar4 = pRVar3->pNext;
              if (pRVar4 == (RenameToken *)0x0) goto LAB_0019c698;
            } while ((char *)pRVar4->p != zLeft);
            ppRVar5 = &pRVar3->pNext;
          }
          *ppRVar5 = pRVar4->pNext;
          pRVar4->pNext = pCtx->pList;
          pCtx->pList = pRVar4;
          pCtx->nList = pCtx->nList + 1;
        }
      }
      else if (zOld != (char *)0x0) {
        iVar2 = sqlite3StrICmp(zLeft,zOld);
        goto LAB_0019c64f;
      }
LAB_0019c698:
      lVar6 = lVar6 + 1;
    } while (lVar6 != iVar1);
  }
  return;
}

Assistant:

static void renameColumnElistNames(
  Parse *pParse, 
  RenameCtx *pCtx, 
  ExprList *pEList, 
  const char *zOld
){
  if( pEList ){
    int i;
    for(i=0; i<pEList->nExpr; i++){
      char *zName = pEList->a[i].zName;
      if( 0==sqlite3_stricmp(zName, zOld) ){
        renameTokenFind(pParse, pCtx, (void*)zName);
      }
    }
  }
}